

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lib.c
# Opt level: O0

int EVP_PKEY_get_octet_string_param
              (EVP_PKEY *pkey,char *key_name,uchar *buf,size_t max_buf_sz,size_t *out_len)

{
  long in_RSI;
  size_t *in_R8;
  int ret2;
  int ret1;
  OSSL_PARAM params [2];
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  OSSL_PARAM *__dest;
  void *in_stack_ffffffffffffff18;
  undefined1 *__dest_00;
  char *in_stack_ffffffffffffff20;
  undefined1 local_b8 [40];
  int local_90;
  int local_8c;
  OSSL_PARAM local_88;
  undefined1 auStack_60 [48];
  size_t *local_30;
  uint local_4;
  
  local_8c = 0;
  local_90 = 0;
  if (in_RSI == 0) {
    local_4 = 0;
  }
  else {
    __dest = &local_88;
    local_30 = in_R8;
    OSSL_PARAM_construct_octet_string
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(size_t)__dest);
    memcpy(__dest,local_b8,0x28);
    __dest_00 = auStack_60;
    OSSL_PARAM_construct_end();
    memcpy(__dest_00,&stack0xffffffffffffff20,0x28);
    local_8c = EVP_PKEY_get_params((EVP_PKEY *)
                                   CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                                   (OSSL_PARAM *)0x276a48);
    if (local_8c != 0) {
      local_90 = OSSL_PARAM_modified(&local_88);
    }
    if ((local_90 != 0) && (local_30 != (size_t *)0x0)) {
      *local_30 = local_88.return_size;
    }
    local_4 = (uint)(local_8c != 0 && local_90 != 0);
  }
  return local_4;
}

Assistant:

int EVP_PKEY_get_octet_string_param(const EVP_PKEY *pkey, const char *key_name,
                                    unsigned char *buf, size_t max_buf_sz,
                                    size_t *out_len)
{
    OSSL_PARAM params[2];
    int ret1 = 0, ret2 = 0;

    if (key_name == NULL)
        return 0;

    params[0] = OSSL_PARAM_construct_octet_string(key_name, buf, max_buf_sz);
    params[1] = OSSL_PARAM_construct_end();
    if ((ret1 = EVP_PKEY_get_params(pkey, params)))
        ret2 = OSSL_PARAM_modified(params);
    if (ret2 && out_len != NULL)
        *out_len = params[0].return_size;
    return ret1 && ret2;
}